

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_map_to_edge(REF_INT map)

{
  uint local_14;
  uint local_10;
  REF_INT bit;
  REF_INT edge;
  REF_INT map_local;
  
  local_14 = 0x800;
  bit = map;
  for (local_10 = 0xb; -1 < (int)local_10; local_10 = local_10 - 1) {
    if ((int)local_14 <= bit) {
      bit = bit - local_14;
      printf("edge %d bit %d\n",(ulong)local_10,(ulong)local_14);
    }
    local_14 = (int)local_14 / 2;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_map_to_edge(REF_INT map) {
  REF_INT edge, bit;

  bit = 2048;
  for (edge = 11; edge >= 0; edge--) {
    if (map >= bit) {
      map -= bit;
      printf("edge %d bit %d\n", edge, bit);
    }
    bit /= 2;
  }

  return REF_SUCCESS;
}